

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuf.c
# Opt level: O3

void * ringbuf_trydequeue(ringbuf *rbuf)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  void *pvVar4;
  bool bVar5;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  do {
    iVar1 = os_semaphore_trywait(&(rbuf->field_3).nused);
  } while (*piVar2 == 4);
  if (*piVar2 != 0xb && iVar1 != 0) {
LAB_00104498:
    abort();
  }
  if ((iVar1 == 0) && (rbuf->running != 0)) {
    LOCK();
    uVar3 = (rbuf->field_0).read_pos;
    (rbuf->field_0).read_pos = (rbuf->field_0).read_pos + 1;
    UNLOCK();
    uVar3 = uVar3 & rbuf->len_mask;
    if (_On_valgrind != 0) {
      ringbuf_trydequeue_cold_1();
    }
    do {
      do {
        pvVar4 = (void *)rbuf[1].field_0.read_pos_padding[uVar3];
      } while (pvVar4 == (void *)0x0);
      LOCK();
      bVar5 = pvVar4 == (void *)rbuf[1].field_0.read_pos_padding[uVar3];
      if (bVar5) {
        rbuf[1].field_0.read_pos_padding[uVar3] = 0;
      }
      UNLOCK();
    } while (!bVar5);
    iVar1 = os_semaphore_post(&(rbuf->field_2).nfree);
    if (iVar1 != 0) goto LAB_00104498;
  }
  else {
    pvVar4 = (void *)0x0;
  }
  return pvVar4;
}

Assistant:

void *
ringbuf_trydequeue(struct ringbuf *rbuf)
{
	LOG(4, NULL);

	if (util_semaphore_trywait(&rbuf->nused) != 0)
		return NULL;

	if (!rbuf->running)
		return NULL;

	void *data = ringbuf_dequeue_atomic(rbuf);

	util_semaphore_post(&rbuf->nfree);

	return data;
}